

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasWeakFields(Descriptor *descriptor,Options *options)

{
  LogMessage *other;
  bool bVar1;
  long lVar2;
  long lVar3;
  LogFinisher local_71;
  Options *local_70;
  LogMessage local_68;
  
  bVar1 = 0 < *(int *)(descriptor + 0x68);
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar2 = 0x78;
    lVar3 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(descriptor + 0x28) + lVar2) + 0x4f) == '\x01') {
        if (options->opensource_runtime != true) {
          return bVar1;
        }
        local_70 = options;
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                   ,0x12e);
        other = internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: !options.opensource_runtime: ");
        internal::LogFinisher::operator=(&local_71,other);
        internal::LogMessage::~LogMessage(&local_68);
        return bVar1;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x98;
      bVar1 = lVar3 < *(int *)(descriptor + 0x68);
    } while (lVar3 < *(int *)(descriptor + 0x68));
  }
  return bVar1;
}

Assistant:

bool HasWeakFields(const Descriptor* descriptor, const Options& options) {
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (IsWeak(descriptor->field(i), options)) return true;
  }
  return false;
}